

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O1

bool __thiscall spv::Builder::isValidInitializer(Builder *this,Id resultId)

{
  Op opcode;
  Instruction *pIVar1;
  bool bVar2;
  Id typeId;
  StorageClass SVar3;
  bool bVar4;
  
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[resultId];
  opcode = pIVar1->opCode;
  bVar2 = isConstantOpCode(this,opcode);
  bVar4 = true;
  if (!bVar2) {
    bVar4 = false;
    typeId = 0;
    if (opcode == OpVariable) {
      if (pIVar1 != (Instruction *)0x0) {
        typeId = pIVar1->typeId;
      }
      SVar3 = Module::getStorageClass(&this->module,typeId);
      bVar4 = SVar3 != Function;
    }
  }
  return bVar4;
}

Assistant:

bool isValidInitializer(Id resultId) const { return isConstant(resultId) || isGlobalVariable(resultId); }